

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

size_t Curl_hash_str(void *key,size_t key_length,size_t slots_num)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  
  if ((long)key_length < 1) {
    uVar2 = 0x1505;
  }
  else {
    pcVar3 = (char *)(key_length + (long)key);
    uVar2 = 0x1505;
    do {
      cVar1 = *key;
      key = (void *)((long)key + 1);
      uVar2 = (long)cVar1 ^ uVar2 * 0x21;
    } while (key < pcVar3);
  }
  return uVar2 % slots_num;
}

Assistant:

size_t Curl_hash_str(void* key, size_t key_length, size_t slots_num)
{
  const char* key_str = (const char *) key;
  const char *end = key_str + key_length;
  unsigned long h = 5381;

  while(key_str < end) {
    h += h << 5;
    h ^= (unsigned long) *key_str++;
  }

  return (h % slots_num);
}